

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O2

void __thiscall ot::commissioner::ProxyClient::SendEmptyChanged(ProxyClient *this,Request *aRequest)

{
  int iVar1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_58;
  undefined1 local_40 [40];
  
  (*aRequest->mEndpoint->_vptr_Endpoint[3])(&_Stack_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&(this->mEndpoint).mPeerAddr.mBytes,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_58);
  iVar1 = (*aRequest->mEndpoint->_vptr_Endpoint[4])();
  (this->mEndpoint).mPeerPort = (uint16_t)iVar1;
  coap::Coap::SendEmptyChanged((Error *)local_40,&this->mCoap,aRequest);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  return;
}

Assistant:

void ProxyClient::SendEmptyChanged(const coap::Request &aRequest)
{
    mEndpoint.SetPeerAddr(aRequest.GetEndpoint()->GetPeerAddr());
    mEndpoint.SetPeerPort(aRequest.GetEndpoint()->GetPeerPort());

    IgnoreError(mCoap.SendEmptyChanged(aRequest));
}